

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O1

bool __thiscall cursespp::LayoutBase::KeyPress(LayoutBase *this,string *key)

{
  char cVar1;
  INavigationKeys *pIVar2;
  undefined1 *puVar3;
  undefined1 auStack_38 [16];
  undefined1 local_28 [16];
  
  puVar3 = auStack_38;
  pIVar2 = Window::NavigationKeys();
  cVar1 = (**(code **)(*(long *)pIVar2 + 0x20))(pIVar2,key);
  if ((cVar1 == '\0') && (cVar1 = (**(code **)(*(long *)pIVar2 + 0x10))(pIVar2,key), cVar1 == '\0'))
  {
    cVar1 = (**(code **)(*(long *)pIVar2 + 0x28))(pIVar2,key);
    if ((cVar1 == '\0') &&
       (cVar1 = (**(code **)(*(long *)pIVar2 + 0x18))(pIVar2,key), cVar1 == '\0')) {
      return false;
    }
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x38])(auStack_38,this);
  }
  else {
    puVar3 = local_28;
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x39])(puVar3,this);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar3 + 8) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar3 + 8));
  }
  return true;
}

Assistant:

bool LayoutBase::KeyPress(const std::string& key) {
    auto& keys = NavigationKeys();
    if (keys.Left(key) || keys.Up(key)) {
        this->FocusPrev();
        return true;
    }
    else if (keys.Right(key) || keys.Down(key)) {
        this->FocusNext();
        return true;
    }
    return false;
}